

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void instrFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined8 *in_RDX;
  int isText;
  int N;
  int typeNeedle;
  int typeHaystack;
  int nNeedle;
  int nHaystack;
  uchar *zNeedle;
  uchar *zHaystack;
  undefined2 uVar4;
  uint in_stack_ffffffffffffffbc;
  int in_stack_ffffffffffffffc0;
  int iVar5;
  int local_2c;
  uchar *local_28;
  byte *local_20;
  
  iVar5 = 1;
  iVar1 = sqlite3_value_type((sqlite3_value *)*in_RDX);
  iVar2 = sqlite3_value_type((sqlite3_value *)in_RDX[1]);
  if ((iVar1 != 5) && (iVar2 != 5)) {
    local_2c = sqlite3_value_bytes((sqlite3_value *)0x1db91d);
    iVar3 = sqlite3_value_bytes((sqlite3_value *)0x1db92f);
    if (0 < iVar3) {
      if ((iVar1 == 4) && (iVar2 == 4)) {
        local_20 = (byte *)sqlite3_value_blob((sqlite3_value *)0x400000004);
        local_28 = (uchar *)sqlite3_value_blob((sqlite3_value *)CONCAT44(iVar1,iVar2));
        in_stack_ffffffffffffffc0 = 0;
      }
      else {
        local_20 = sqlite3_value_text((sqlite3_value *)0x1db988);
        local_28 = sqlite3_value_text((sqlite3_value *)0x1db99b);
        in_stack_ffffffffffffffc0 = 1;
      }
      if (local_28 == (uchar *)0x0) {
        return;
      }
      if ((local_2c != 0) && (local_20 == (byte *)0x0)) {
        return;
      }
      while( true ) {
        in_stack_ffffffffffffffbc = in_stack_ffffffffffffffbc & 0xffffff;
        if (iVar3 <= local_2c) {
          iVar1 = memcmp(local_20,local_28,(long)iVar3);
          in_stack_ffffffffffffffbc = CONCAT13(iVar1 != 0,(int3)in_stack_ffffffffffffffbc);
        }
        if ((char)(in_stack_ffffffffffffffbc >> 0x18) == '\0') break;
        iVar5 = iVar5 + 1;
        do {
          local_2c = local_2c + -1;
          local_20 = local_20 + 1;
          uVar4 = (undefined2)in_stack_ffffffffffffffbc;
          in_stack_ffffffffffffffbc = in_stack_ffffffffffffffbc & 0xffff;
          if (in_stack_ffffffffffffffc0 != 0) {
            in_stack_ffffffffffffffbc = (uint)CONCAT12((*local_20 & 0xc0) == 0x80,uVar4);
          }
        } while ((char)(in_stack_ffffffffffffffbc >> 0x10) != '\0');
      }
      if (local_2c < iVar3) {
        iVar5 = 0;
      }
    }
    sqlite3_result_int((sqlite3_context *)CONCAT44(iVar5,in_stack_ffffffffffffffc0),
                       in_stack_ffffffffffffffbc);
  }
  return;
}

Assistant:

static void instrFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  const unsigned char *zHaystack;
  const unsigned char *zNeedle;
  int nHaystack;
  int nNeedle;
  int typeHaystack, typeNeedle;
  int N = 1;
  int isText;

  UNUSED_PARAMETER(argc);
  typeHaystack = sqlite3_value_type(argv[0]);
  typeNeedle = sqlite3_value_type(argv[1]);
  if( typeHaystack==SQLITE_NULL || typeNeedle==SQLITE_NULL ) return;
  nHaystack = sqlite3_value_bytes(argv[0]);
  nNeedle = sqlite3_value_bytes(argv[1]);
  if( nNeedle>0 ){
    if( typeHaystack==SQLITE_BLOB && typeNeedle==SQLITE_BLOB ){
      zHaystack = sqlite3_value_blob(argv[0]);
      zNeedle = sqlite3_value_blob(argv[1]);
      isText = 0;
    }else{
      zHaystack = sqlite3_value_text(argv[0]);
      zNeedle = sqlite3_value_text(argv[1]);
      isText = 1;
    }
    if( zNeedle==0 || (nHaystack && zHaystack==0) ) return;
    while( nNeedle<=nHaystack && memcmp(zHaystack, zNeedle, nNeedle)!=0 ){
      N++;
      do{
        nHaystack--;
        zHaystack++;
      }while( isText && (zHaystack[0]&0xc0)==0x80 );
    }
    if( nNeedle>nHaystack ) N = 0;
  }
  sqlite3_result_int(context, N);
}